

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O1

int __thiscall
Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::Connect(Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *this,function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *slot)

{
  function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  pair<int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_38;
  
  local_38.first = this->current_id_ + 1;
  this->current_id_ = local_38.first;
  this_00 = &local_38.second;
  std::
  function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00,slot);
  std::
  _Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>>>
  ::
  _M_emplace_unique<std::pair<int,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>>
            ((_Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>>>>
              *)this,&local_38);
  if (local_38.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.second.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }